

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O3

void __thiscall
chrono::ChVariablesNode::MultiplyAndAdd
          (ChVariablesNode *this,ChVectorRef *result,ChVectorConstRef vect,double c_a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  PointerType pdVar7;
  long lVar8;
  double dVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  uVar4 = (this->super_ChVariables).offset;
  lVar10 = (long)(int)uVar4;
  if ((-1 < lVar10) &&
     (uVar5 = (vect->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ).
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_rows.m_value, lVar10 < (long)uVar5)) {
    uVar6 = *(ulong *)&(result->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                       ).field_0x8;
    if (lVar10 < (long)uVar6) {
      dVar9 = c_a * this->mass;
      pdVar7 = (vect->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               .m_data;
      lVar8 = *(long *)&result->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      uVar12 = (ulong)uVar4;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = pdVar7[lVar10];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(lVar8 + lVar10 * 8);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar9;
      auVar1 = vfmadd213sd_fma(auVar15,auVar13,auVar1);
      *(long *)(lVar8 + lVar10 * 8) = auVar1._0_8_;
      if (uVar5 <= uVar12 + 1) goto LAB_007e29e6;
      if (uVar12 + 1 < uVar6) {
        auVar16._8_8_ = 0;
        auVar16._0_8_ = pdVar7[uVar12 + 1];
        uVar11 = (ulong)(uVar4 + 2);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(lVar8 + 8 + uVar12 * 8);
        auVar1 = vfmadd213sd_fma(auVar16,auVar13,auVar2);
        *(long *)(lVar8 + 8 + uVar12 * 8) = auVar1._0_8_;
        if (uVar5 <= uVar11) goto LAB_007e29e6;
        if (uVar11 < uVar6) {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = pdVar7[uVar11];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(lVar8 + uVar11 * 8);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = dVar9;
          auVar1 = vfmadd213sd_fma(auVar17,auVar14,auVar3);
          *(long *)(lVar8 + uVar11 * 8) = auVar1._0_8_;
          return;
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                 );
  }
LAB_007e29e6:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

void ChVariablesNode::MultiplyAndAdd(ChVectorRef result, ChVectorConstRef vect, const double c_a) const {
    // optimized unrolled operations
    double scaledmass = c_a * mass;
    result(this->offset) += scaledmass * vect(this->offset);
    result(this->offset + 1) += scaledmass * vect(this->offset + 1);
    result(this->offset + 2) += scaledmass * vect(this->offset + 2);
}